

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

int __thiscall TSparseArray::LoadFromStream(TSparseArray *this,TByteStream *InStream)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  TByteStream *pTVar5;
  TSparseArray *pTVar6;
  
  pTVar5 = InStream;
  pTVar6 = this;
  iVar2 = TGenericArray<unsigned_int>::LoadFromStream(&this->ItemBits,InStream);
  if (iVar2 == 0) {
    uVar1 = InStream->cbByteData;
    if (uVar1 < 4) {
      iVar2 = 1000;
    }
    else {
      pTVar5 = (TByteStream *)InStream->pbByteData;
      InStream->pbByteData = (LPBYTE)((long)&pTVar5->pbByteData + 4);
      InStream->cbByteData = uVar1 - 4;
      iVar2 = 0;
    }
    uVar3 = 0;
    if (3 < uVar1) {
      uVar3 = *(uint *)&pTVar5->pbByteData;
      iVar2 = 0;
    }
    if (iVar2 == 0) {
      uVar1 = InStream->cbByteData;
      if (uVar1 < 4) {
        iVar2 = 1000;
      }
      else {
        pTVar6 = (TSparseArray *)InStream->pbByteData;
        InStream->pbByteData = (LPBYTE)((long)&(pTVar6->ItemBits).ItemArray + 4);
        InStream->cbByteData = uVar1 - 4;
        iVar2 = 0;
      }
      uVar4 = 0;
      if (3 < uVar1) {
        uVar4 = *(uint *)&(pTVar6->ItemBits).ItemArray;
        iVar2 = 0;
      }
      if ((iVar2 == 0) && (iVar2 = 0x3ec, uVar4 <= uVar3)) {
        this->TotalItemCount = (ulong)uVar3;
        this->ValidItemCount = (ulong)uVar4;
        iVar2 = TGenericArray<_BASEVALS>::LoadFromStream(&this->BaseVals,InStream);
        if (iVar2 == 0) {
          iVar2 = TGenericArray<unsigned_int>::LoadFromStream(&this->IndexToItem0,InStream);
          if (iVar2 == 0) {
            iVar2 = TGenericArray<unsigned_int>::LoadFromStream(&this->IndexToItem1,InStream);
            return iVar2;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD total_count = 0;
        DWORD valid_count = 0;
        int nError;

        nError = ItemBits.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.GetValue<DWORD>(total_count);
        if(nError != ERROR_SUCCESS)
            return nError;
        nError = InStream.GetValue<DWORD>(valid_count);
        if(nError != ERROR_SUCCESS)
            return nError;
        if(valid_count > total_count)
            return ERROR_FILE_CORRUPT;

        TotalItemCount = total_count;
        ValidItemCount = valid_count;

        nError = BaseVals.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = IndexToItem0.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = IndexToItem1.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        return ERROR_SUCCESS;
    }